

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

int __thiscall embree::XMLWriter::close(XMLWriter *this,int __fd)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  
  this->ident = this->ident - 2;
  tab(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"</");
  poVar1 = std::operator<<(poVar1,(string *)CONCAT44(in_register_00000034,__fd));
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return (int)poVar1;
}

Assistant:

void XMLWriter::close(std::string str)
  {
    assert(ident>=2);
    ident-=2;
    tab(); xml << "</" << str << ">" << std::endl;
  }